

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O3

aiMesh * __thiscall Assimp::SkeletonMeshBuilder::CreateMesh(SkeletonMeshBuilder *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  pointer paVar6;
  pointer paVar7;
  pointer pFVar8;
  pointer __src;
  pointer ppaVar9;
  uint n;
  aiMesh *paVar10;
  aiVector3D *paVar11;
  ulong *puVar12;
  aiFace *paVar13;
  aiFace *paVar14;
  uint *puVar15;
  long lVar16;
  aiBone **__dest;
  size_t sVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  pointer pFVar21;
  float fVar22;
  undefined8 uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  paVar10 = (aiMesh *)operator_new(0x520);
  paVar10->mPrimitiveTypes = 0;
  paVar10->mNumFaces = 0;
  memset(&paVar10->mNormals,0,0xc4);
  paVar10->mBones = (aiBone **)0x0;
  paVar10->mMaterialIndex = 0;
  (paVar10->mName).length = 0;
  (paVar10->mName).data[0] = '\0';
  memset((paVar10->mName).data + 1,0x1b,0x3ff);
  paVar10->mNumAnimMeshes = 0;
  paVar10->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar10->mMethod = 0;
  (paVar10->mAABB).mMin.x = 0.0;
  (paVar10->mAABB).mMin.y = 0.0;
  (paVar10->mAABB).mMin.z = 0.0;
  (paVar10->mAABB).mMax.x = 0.0;
  (paVar10->mAABB).mMax.y = 0.0;
  (paVar10->mAABB).mMax.z = 0.0;
  memset(paVar10->mColors,0,0xa0);
  paVar6 = (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar7 = (this->mVertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar17 = (long)paVar7 - (long)paVar6;
  uVar20 = ((long)sVar17 >> 2) * -0x5555555555555555;
  uVar19 = (uint)uVar20;
  paVar10->mNumVertices = uVar19;
  uVar20 = uVar20 & 0xffffffff;
  uVar18 = uVar20 * 0xc;
  paVar11 = (aiVector3D *)operator_new__(uVar18);
  if (uVar20 != 0) {
    memset(paVar11,0,((uVar18 - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar10->mVertices = paVar11;
  if (paVar7 != paVar6) {
    memmove(paVar11,paVar6,sVar17);
  }
  paVar11 = (aiVector3D *)operator_new__(uVar18);
  if (uVar19 != 0) {
    memset(paVar11,0,((uVar18 - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar10->mNormals = paVar11;
  uVar20 = ((long)(this->mFaces).
                  super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mFaces).
                  super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  paVar10->mNumFaces = (uint)uVar20;
  uVar18 = uVar20 & 0xffffffff;
  puVar12 = (ulong *)operator_new__(uVar18 * 0x10 + 8);
  *puVar12 = uVar18;
  paVar13 = (aiFace *)(puVar12 + 1);
  if (uVar18 != 0) {
    paVar14 = paVar13;
    do {
      paVar14->mNumIndices = 0;
      paVar14->mIndices = (uint *)0x0;
      paVar14 = paVar14 + 1;
    } while (paVar14 != paVar13 + uVar18);
  }
  paVar10->mFaces = paVar13;
  if ((uint)uVar20 != 0) {
    paVar6 = (this->mVertices).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar8 = (this->mFaces).
             super__Vector_base<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar18 = 0;
    pFVar21 = pFVar8;
    do {
      paVar13[uVar18].mNumIndices = 3;
      puVar15 = (uint *)operator_new__(0xc);
      puVar12[uVar18 * 2 + 2] = (ulong)puVar15;
      *puVar15 = pFVar8[uVar18].mIndices[0];
      puVar15[1] = pFVar8[uVar18].mIndices[1];
      uVar19 = pFVar8[uVar18].mIndices[2];
      puVar15[2] = uVar19;
      uVar5 = pFVar8[uVar18].mIndices[1];
      fVar24 = paVar6[uVar19].x - paVar6[pFVar8[uVar18].mIndices[0]].x;
      uVar1 = paVar6[uVar19].y;
      uVar3 = paVar6[uVar19].z;
      uVar2 = paVar6[pFVar8[uVar18].mIndices[0]].y;
      uVar4 = paVar6[pFVar8[uVar18].mIndices[0]].z;
      fVar22 = paVar6[uVar5].y - (float)uVar2;
      fVar26 = paVar6[uVar5].z - (float)uVar4;
      fVar27 = paVar6[uVar5].x - paVar6[pFVar8[uVar18].mIndices[0]].x;
      fVar25 = ((float)uVar1 - (float)uVar2) * fVar26 - fVar22 * ((float)uVar3 - (float)uVar4);
      fVar26 = ((float)uVar3 - (float)uVar4) * fVar27 - fVar26 * fVar24;
      fVar22 = fVar22 * fVar24 - fVar27 * ((float)uVar1 - (float)uVar2);
      fVar24 = SQRT(fVar22 * fVar22 + fVar25 * fVar25 + fVar26 * fVar26);
      uVar23 = 0x3f800000;
      if (1e-05 <= fVar24) {
        uVar23 = CONCAT44(fVar26,fVar25);
      }
      fVar25 = 0.0;
      if (1e-05 <= fVar24) {
        fVar25 = fVar22;
      }
      lVar16 = 0;
      do {
        uVar19 = pFVar21->mIndices[lVar16];
        paVar11[uVar19].x = (float)(int)uVar23;
        paVar11[uVar19].y = (float)(int)((ulong)uVar23 >> 0x20);
        paVar11[uVar19].z = fVar25;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      uVar18 = uVar18 + 1;
      pFVar21 = pFVar21 + 1;
    } while (uVar18 != (uVar20 & 0xffffffff));
  }
  __src = (this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  ppaVar9 = (this->mBones).super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar18 = (long)ppaVar9 - (long)__src;
  paVar10->mNumBones = (uint)(uVar18 >> 3);
  __dest = (aiBone **)operator_new__(uVar18 & 0x7fffffff8);
  paVar10->mBones = __dest;
  sVar17 = (long)ppaVar9 - (long)__src;
  if (sVar17 != 0) {
    memmove(__dest,__src,sVar17);
  }
  paVar10->mMaterialIndex = 0;
  return paVar10;
}

Assistant:

aiMesh* SkeletonMeshBuilder::CreateMesh()
{
    aiMesh* mesh = new aiMesh();

    // add points
    mesh->mNumVertices = static_cast<unsigned int>(mVertices.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy( mVertices.begin(), mVertices.end(), mesh->mVertices);

    mesh->mNormals = new aiVector3D[mesh->mNumVertices];

    // add faces
    mesh->mNumFaces = static_cast<unsigned int>(mFaces.size());
    mesh->mFaces = new aiFace[mesh->mNumFaces];
    for( unsigned int a = 0; a < mesh->mNumFaces; a++)
    {
        const Face& inface = mFaces[a];
        aiFace& outface = mesh->mFaces[a];
        outface.mNumIndices = 3;
        outface.mIndices = new unsigned int[3];
        outface.mIndices[0] = inface.mIndices[0];
        outface.mIndices[1] = inface.mIndices[1];
        outface.mIndices[2] = inface.mIndices[2];

        // Compute per-face normals ... we don't want the bones to be smoothed ... they're built to visualize
        // the skeleton, so it's good if there's a visual difference to the rest of the geometry
        aiVector3D nor = ((mVertices[inface.mIndices[2]] - mVertices[inface.mIndices[0]]) ^
            (mVertices[inface.mIndices[1]] - mVertices[inface.mIndices[0]]));

        if (nor.Length() < 1e-5) /* ensure that FindInvalidData won't remove us ...*/
            nor = aiVector3D(1.0,0.0,0.0);

        for (unsigned int n = 0; n < 3; ++n)
            mesh->mNormals[inface.mIndices[n]] = nor;
    }

    // add the bones
    mesh->mNumBones = static_cast<unsigned int>(mBones.size());
    mesh->mBones = new aiBone*[mesh->mNumBones];
    std::copy( mBones.begin(), mBones.end(), mesh->mBones);

    // default
    mesh->mMaterialIndex = 0;

    return mesh;
}